

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

SelectionManager * __thiscall
OpenMD::SelectionManager::removeAtomsInRigidBodies
          (SelectionManager *__return_storage_ptr__,SelectionManager *this)

{
  StuntDouble *pSVar1;
  _func_int *p_Var2;
  _func_int **pp_Var3;
  RigidBody *rb;
  int isd;
  SelectionSet ssAtoms;
  int local_54;
  SelectionSet local_50;
  _Vector_base<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_38,&this->nObjects_);
  SelectionSet::SelectionSet(&local_50,(vector<int,_std::allocator<int>_> *)&local_38);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_38);
  SelectionSet::clearAll(&local_50);
  SelectionManager(__return_storage_ptr__,this);
  pSVar1 = beginSelected(__return_storage_ptr__,&local_54);
  while (pSVar1 != (StuntDouble *)0x0) {
    if (pSVar1->objType_ == otRigidBody) {
      pp_Var3 = (_func_int **)pSVar1[2].mass_;
      if (pp_Var3 != pSVar1[2].properties_._vptr_PropertyMap) goto LAB_00202860;
      p_Var2 = (_func_int *)0x0;
      while (p_Var2 != (_func_int *)0x0) {
        OpenMDBitSet::setBitOn
                  (local_50.bitsets_.
                   super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
                   _M_impl.super__Vector_impl_data._M_start,(long)*(int *)(p_Var2 + 0x28));
        pp_Var3 = pp_Var3 + 1;
        p_Var2 = (_func_int *)0x0;
        if (pp_Var3 != pSVar1[2].properties_._vptr_PropertyMap) {
LAB_00202860:
          p_Var2 = *pp_Var3;
        }
      }
    }
    pSVar1 = nextSelected(__return_storage_ptr__,&local_54);
  }
  SelectionSet::operator-=(&__return_storage_ptr__->ss_,&local_50);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_50.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionManager SelectionManager::removeAtomsInRigidBodies() const {
    SelectionSet ssAtoms(nObjects_);
    ssAtoms.clearAll();

    SelectionManager tempSeleMan = *this;

    StuntDouble* sd;
    int isd;
    std::vector<Atom*>::iterator ai;
    Atom* atom;
    for (sd = tempSeleMan.beginSelected(isd); sd != NULL;
         sd = tempSeleMan.nextSelected(isd)) {
      if (sd->isRigidBody()) {
        RigidBody* rb = static_cast<RigidBody*>(sd);
        for (atom = rb->beginAtom(ai); atom != NULL; atom = rb->nextAtom(ai)) {
          ssAtoms.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
        }
      }
    }

    // Remove the atoms in rigid bodies from our selection set.
    tempSeleMan.ss_ -= ssAtoms;

    return tempSeleMan;
  }